

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gogoing_util.cpp
# Opt level: O0

void * going_calloc(size_t nmemb,size_t size)

{
  FILE *__stream;
  void *pvVar1;
  int *piVar2;
  char *local_30;
  void *ptr;
  size_t size_local;
  size_t nmemb_local;
  
  pvVar1 = calloc(nmemb,size);
  __stream = _stderr;
  if (pvVar1 == (void *)0x0) {
    piVar2 = __errno_location();
    if (*piVar2 == 0) {
      local_30 = "None";
    }
    else {
      piVar2 = __errno_location();
      local_30 = strerror(*piVar2);
    }
    fprintf(__stream,"[ERROR] (%s:%d: errno: %s) going_calloc failed.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/tangwz[P]Gogoing/src/Gogoing_util.cpp"
            ,0x1a6,local_30);
    exit(-1);
  }
  return pvVar1;
}

Assistant:

void *going_calloc(size_t nmemb, size_t size)
{
	void *ptr = calloc(nmemb, size);
	if(NULL == ptr){
		log_err("going_calloc failed.");
		exit(-1);
	}
	return ptr;
}